

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YuvImageProcessor.cpp
# Opt level: O2

void MMXProcessor(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  char (*pacVar7) [1920];
  char cVar8;
  char cVar9;
  uint uVar10;
  ushort uVar11;
  char cVar12;
  void *pvVar13;
  int i;
  ulong uVar14;
  long lVar15;
  int j_1;
  long lVar16;
  int i_1;
  ulong uVar17;
  int j;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  uint uVar21;
  undefined8 uVar22;
  int iVar24;
  undefined8 uVar23;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM6 [16];
  
  uVar14 = 0xffffffffffffffff;
  if (-1 < (long)size) {
    uVar14 = (long)size * 8;
  }
  pvVar5 = operator_new__(uVar14);
  auVar2 = _DAT_001030d0;
  pacVar7 = y;
  uVar19 = 0;
  pvVar13 = pvVar5;
  for (uVar14 = 0; uVar14 != 0x438; uVar14 = uVar14 + 1) {
    uVar17 = uVar14 >> 1 & 0x7fffffff;
    for (uVar18 = 0; uVar18 != 0x780; uVar18 = uVar18 + 1) {
      uVar25 = uVar18 >> 1 & 0x7fffffff;
      uVar20 = CONCAT26((short)uVar19,
                        CONCAT24((byte)v[uVar17][uVar25] - 0x80,
                                 CONCAT22((byte)u[uVar17][uVar25] - 0x80,
                                          (byte)(*pacVar7)[uVar18] - 0x10)));
      uVar25 = pmaddwd(uVar20,0x1990000012a);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar25;
      uVar22 = pmaddwd(uVar20,0x204012a);
      uVar25 = pmaddwd(uVar20,0xff30ff9c012a);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar25;
      auVar1 = vpunpcklqdq_avx(auVar26,auVar28);
      auVar27 = vpunpckldq_avx(auVar26,auVar28);
      auVar1 = vpshufb_avx(auVar1,auVar2);
      vpaddd_avx(auVar27,auVar1);
      uVar19 = movdq2q(uVar19,in_XMM6);
      iVar4 = (int)((ulong)uVar22 >> 0x20);
      uVar21 = (int)uVar22 + 0x80 >> 8;
      iVar24 = iVar4 + 0x80 >> 8;
      uVar10 = 0xff;
      if (uVar21 < 0xff) {
        uVar10 = uVar21;
      }
      uVar11 = (ushort)uVar10;
      if ((int)uVar21 < 0) {
        uVar11 = 0;
      }
      iVar3 = iVar24;
      if (0xffffffffff < CONCAT44(iVar24,uVar21)) {
        iVar3 = 0xff;
      }
      if (iVar24 < 0) {
        iVar3 = 0;
      }
      uVar10 = (int)uVar22 + 0x80 + iVar4 >> 8;
      auVar1 = vpinsrw_avx(ZEXT216(uVar11),iVar3,1);
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      auVar1 = vpinsrw_avx(auVar1,~((int)uVar10 >> 0x1f) & uVar10,2);
      *(long *)((long)pvVar13 + uVar18 * 8) = auVar1._0_8_;
    }
    pvVar13 = (void *)((long)pvVar13 + 0x3c00);
    pacVar7 = pacVar7 + 1;
  }
  uVar19 = 0x1900810042;
  for (lVar6 = 0; lVar6 != 0x55; lVar6 = lVar6 + 1) {
    uVar14 = lVar6 * 3 + 1U & 0xffffffff;
    lVar15 = 0;
    uVar17 = 0;
    uVar20 = pshufw(uVar14,uVar14,0);
    pvVar13 = pvVar5;
    for (; uVar17 != 0x438; uVar17 = uVar17 + 1) {
      for (uVar14 = 0; uVar14 != 0x780; uVar14 = uVar14 + 1) {
        uVar22 = *(undefined8 *)((long)pvVar13 + uVar14 * 8);
        uVar22 = CONCAT26((ushort)((short)((ulong)uVar22 >> 0x30) * (short)((ulong)uVar20 >> 0x30))
                          >> 8,CONCAT24((ushort)((short)((ulong)uVar22 >> 0x20) *
                                                (short)((ulong)uVar20 >> 0x20)) >> 8,
                                        CONCAT22((ushort)((short)((ulong)uVar22 >> 0x10) *
                                                         (short)((ulong)uVar20 >> 0x10)) >> 8,
                                                 (ushort)((short)uVar22 * (short)uVar20) >> 8)));
        uVar18 = pmaddwd(uVar22,uVar19);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar18;
        uVar23 = pmaddwd(uVar22,0xffeeffa20070);
        uVar18 = pmaddwd(uVar22,0x70ffb6ffda);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar18;
        auVar1 = vpunpcklqdq_avx(auVar27,auVar29);
        auVar27 = vpunpckldq_avx(auVar27,auVar29);
        auVar1 = vpshufb_avx(auVar1,auVar2);
        vpaddd_avx(auVar27,auVar1);
        uVar19 = movdq2q(uVar19,in_XMM6);
        iVar4 = (int)((ulong)uVar23 >> 0x20);
        uVar21 = ((int)uVar23 + 0x80 >> 8) + 0x10;
        iVar24 = (iVar4 + 0x80 >> 8) + 0x80;
        uVar10 = 0xff;
        if (uVar21 < 0xff) {
          uVar10 = uVar21;
        }
        cVar12 = (char)uVar10;
        if ((int)uVar21 < 0) {
          cVar12 = '\0';
        }
        iVar3 = iVar24;
        if (0xffffffffff < CONCAT44(iVar24,uVar21)) {
          iVar3 = 0xff;
        }
        cVar8 = (char)iVar3;
        iVar4 = (int)uVar23 + 0x80 + iVar4;
        cVar9 = '\x7f';
        if (iVar24 < 0) {
          cVar8 = '\0';
        }
        iVar24 = iVar4 >> 8;
        if (iVar24 < 0x7f) {
          cVar9 = (char)((uint)iVar4 >> 8);
        }
        cVar9 = cVar9 + -0x80;
        if (iVar24 < -0x80) {
          cVar9 = '\0';
        }
        result[lVar6][0][uVar14 + lVar15] = cVar12;
        lVar16 = (uVar14 >> 1 & 0x7fffffff) + (ulong)(((uint)(uVar17 >> 1) & 0x7fffffff) * 0x3c0);
        result[lVar6][1][lVar16] = cVar8;
        result[lVar6][2][lVar16] = cVar9;
      }
      lVar15 = lVar15 + 0x780;
      pvVar13 = (void *)((long)pvVar13 + 0x3c00);
    }
  }
  operator_delete__(pvVar5);
  return;
}

Assistant:

void MMXProcessor() {
    auto *data = new __m64[size];
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            auto yi = (uint8_t) y[i][j];
            auto ui = (uint8_t) u[i / 2][j / 2];
            auto vi = (uint8_t) v[i / 2][j / 2];
            __m64 yuv = _mm_setr_pi16(16, 128, 128, 0);
            yuv = _mm_sub_pi16(_mm_setr_pi16(yi, ui, vi, 0), yuv);
            __m64 r = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 0, 409, 0));
            __m64 g = _mm_madd_pi16(yuv, _mm_setr_pi16(298, -100, -208, 0));
            __m64 b = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 516, 0, 0));
            int rr = (_mm_cvtsi64_si32(r) + int(_mm_cvtm64_si64(r) >> 32));
            int gg = (_mm_cvtsi64_si32(g) + int(_mm_cvtm64_si64(g) >> 32));
            int bb = (_mm_cvtsi64_si32(b) + int(_mm_cvtm64_si64(b) >> 32));
            __m64 val = _mm_setr_pi32(rr, gg);
            val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
            val = _mm_srai_pi32(val, 8);
            int ri = between(_mm_cvtsi64_si32(val));
            int gi = between(int(_mm_cvtm64_si64(val)>>32));
            int bi = between((bb + 128) >> 8);
            data[i * width + j] = _mm_setr_pi16(ri, gi, bi, 0);
        }
    }
    for (int num = 0; num < frame_num; num++) {
        int a = num * 3 + 1;
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                int offset = i * width + j;
                __m64 rgb = _mm_srli_pi16(_mm_mullo_pi16(data[offset], _mm_set1_pi16(a)), 8);
                __m64 yi = (_mm_madd_pi16(rgb, _mm_setr_pi16(66, 129, 25, 0)));
                __m64 ui = (_mm_madd_pi16(rgb, _mm_setr_pi16(-38, -74, 112, 0)));
                __m64 vi = (_mm_madd_pi16(rgb, _mm_setr_pi16(112, -94, -18, 0)));
                int yy = (_mm_cvtsi64_si32(yi) + int(_mm_cvtm64_si64(yi) >> 32));
                int uu = (_mm_cvtsi64_si32(ui) + int(_mm_cvtm64_si64(ui) >> 32));
                int vv = (_mm_cvtsi64_si32(vi) + int(_mm_cvtm64_si64(vi) >> 32));
                __m64 val = _mm_setr_pi32(yy, uu);
                val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
                val = _mm_srai_pi32(val, 8);
                val = _mm_add_pi32(val, _mm_setr_pi32(16, 128));
                int ri = between(_mm_cvtsi64_si32(val));
                int gi = between(int(_mm_cvtm64_si64(val)>>32));
                int bi = between(((vv + 128) >> 8) + 128);
                result[num][0][offset] = ri;
                result[num][1][(i / 2) * (width / 2) + j / 2] = gi;
                result[num][2][(i / 2) * (width / 2) + j / 2] = bi;
            }
        }
    }
    delete[] data;
}